

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLoadStore
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  element_type *peVar1;
  bool bVar2;
  Expression *pEVar3;
  size_t sVar4;
  undefined4 in_register_0000000c;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  uint in_R8D;
  char *pcVar9;
  long *plVar10;
  bool bVar11;
  initializer_list<AssemblyTemplateArgument> variables;
  string macroText;
  char *local_168;
  string local_140;
  char *local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  char *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  char *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  char *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  char *local_80;
  string local_78;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  switch(in_R8D & 0x3000f) {
  case 0x10001:
    local_168 = "lb";
    break;
  case 0x10002:
    local_168 = "lbu";
    break;
  case 0x10003:
    local_168 = "lh";
    break;
  case 0x10004:
    local_168 = "lhu";
    break;
  case 0x10005:
    local_168 = "lw";
    break;
  case 0x10006:
    local_168 = "lwu";
    break;
  case 0x10007:
    local_168 = "ld";
    break;
  case 0x10008:
    local_168 = "ll";
    break;
  case 0x10009:
    local_168 = "lld";
    break;
  case 0x1000a:
    local_168 = "lwc1";
    goto LAB_00182d8b;
  case 0x1000b:
    local_168 = "lwc2";
    goto LAB_00182d8b;
  case 0x1000c:
    local_168 = "ldc1";
    goto LAB_00182d8b;
  case 0x1000d:
    local_168 = "ldc2";
LAB_00182d8b:
    bVar2 = true;
    goto LAB_00182dac;
  default:
    switch(in_R8D & 0x3000f) {
    case 0x20001:
      local_168 = "sb";
      break;
    default:
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )parser;
    case 0x20003:
      local_168 = "sh";
      break;
    case 0x20005:
      local_168 = "sw";
      break;
    case 0x20007:
      local_168 = "sd";
      break;
    case 0x20008:
      local_168 = "sc";
      break;
    case 0x20009:
      local_168 = "scd";
      break;
    case 0x2000a:
      local_168 = "swc1";
      goto LAB_00182d8b;
    case 0x2000b:
      local_168 = "swc2";
      goto LAB_00182d8b;
    case 0x2000c:
      local_168 = "sdc1";
      goto LAB_00182d8b;
    case 0x2000d:
      local_168 = "sdc2";
      goto LAB_00182d8b;
    }
  }
  bVar2 = false;
LAB_00182dac:
  preprocessMacro_abi_cxx11_
            (&local_140,
             "\n\t\t.if %imm% & ~0xFFFFFFFF\n\t\t\t.error \"Address too big\"\n\t\t.elseif %imm% < 0x8000 || (%imm% & 0xFFFF8000) == 0xFFFF8000\n\t\t\t.if %lower%\n\t\t\t\t%op%\t%rs%, lo(%imm%)(r0)\n\t\t\t.elseif %upper%\n\t\t\t\tnop\n\t\t\t.endif\n\t\t.else\n\t\t\t.if %upper%\n\t\t\t\tlui\t\t%temp%, hi(%imm%)\n\t\t\t.endif\n\t\t\t.if %lower%\n\t\t\t\t%op%\t%rs%, lo(%imm%)(%temp%)\n\t\t\t.endif\n\t\t.endif\n\t"
             ,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  bVar11 = (in_R8D >> 0xe & 1) == 0;
  pcVar9 = "1";
  pcVar8 = "1";
  if (bVar11) {
    pcVar8 = "0";
  }
  local_120 = "%upper%";
  local_118[0] = local_108;
  pcVar6 = "";
  pcVar5 = "";
  if (bVar11) {
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,pcVar8,pcVar5);
  local_f8 = "%lower%";
  bVar11 = -1 < (short)in_R8D;
  if (bVar11) {
    pcVar9 = "0";
  }
  local_f0[0] = local_e0;
  if (bVar11) {
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,pcVar9,pcVar6);
  local_d0 = "%rs%";
  pEVar3 = &(immediates->primary).expression;
  if (bVar2) {
    pEVar3 = (Expression *)&immediates[1].secondary.value;
  }
  local_c8[0] = local_b8;
  peVar1 = (pEVar3->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,peVar1,
             (long)&((pEVar3->expression).
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  local_a8 = "%temp%";
  local_a0[0] = local_90;
  if ((bool)((in_R8D >> 0x11 & 1) == 0 & (bVar2 ^ 1U))) {
    peVar1 = (immediates->primary).expression.expression.
             super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,peVar1,
               (long)&((immediates->primary).expression.expression.
                       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"r1","");
  }
  local_80 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_78,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  local_58 = "%op%";
  plVar10 = local_40;
  local_50[0] = plVar10;
  sVar4 = strlen(local_168);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_168,local_168 + sVar4);
  variables._M_len = (size_type)&local_120;
  variables._M_array = (iterator)(ulong)in_R8D;
  createMacro(parser,(string *)registers,(int)&local_140,variables);
  lVar7 = -0xf0;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -5;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLoadStore(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLoadStore = R"(
		.if %imm% & ~0xFFFFFFFF
			.error "Address too big"
		.elseif %imm% < 0x8000 || (%imm% & 0xFFFF8000) == 0xFFFF8000
			.if %lower%
				%op%	%rs%, lo(%imm%)(r0)
			.elseif %upper%
				nop
			.endif
		.else
			.if %upper%
				lui		%temp%, hi(%imm%)
			.endif
			.if %lower%
				%op%	%rs%, lo(%imm%)(%temp%)
			.endif
		.endif
	)";

	const char* op;
	bool isCop = false;
	switch (flags & (MIPSM_ACCESSMASK|MIPSM_LOAD|MIPSM_STORE))
	{
	case MIPSM_LOAD|MIPSM_B:		op = "lb"; break;
	case MIPSM_LOAD|MIPSM_BU:		op = "lbu"; break;
	case MIPSM_LOAD|MIPSM_HW:		op = "lh"; break;
	case MIPSM_LOAD|MIPSM_HWU:		op = "lhu"; break;
	case MIPSM_LOAD|MIPSM_W:		op = "lw"; break;
	case MIPSM_LOAD|MIPSM_WU:		op = "lwu"; break;
	case MIPSM_LOAD|MIPSM_DW:		op = "ld"; break;
	case MIPSM_LOAD|MIPSM_LLSCW:	op = "ll"; break;
	case MIPSM_LOAD|MIPSM_LLSCDW:	op = "lld"; break;
	case MIPSM_LOAD|MIPSM_COP1:		op = "lwc1"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_COP2:		op = "lwc2"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_DCOP1:	op = "ldc1"; isCop = true; break;
	case MIPSM_LOAD|MIPSM_DCOP2:	op = "ldc2"; isCop = true; break;
	case MIPSM_STORE|MIPSM_B:		op = "sb"; break;
	case MIPSM_STORE|MIPSM_HW:		op = "sh"; break;
	case MIPSM_STORE|MIPSM_W:		op = "sw"; break;
	case MIPSM_STORE|MIPSM_DW:		op = "sd"; break;
	case MIPSM_STORE|MIPSM_LLSCW:	op = "sc"; break;
	case MIPSM_STORE|MIPSM_LLSCDW:	op = "scd"; break;
	case MIPSM_STORE|MIPSM_COP1:	op = "swc1"; isCop = true; break;
	case MIPSM_STORE|MIPSM_COP2:	op = "swc2"; isCop = true; break;
	case MIPSM_STORE|MIPSM_DCOP1:	op = "sdc1"; isCop = true; break;
	case MIPSM_STORE|MIPSM_DCOP2:	op = "sdc2"; isCop = true; break;
	default: return nullptr;
	}

	std::string macroText = preprocessMacro(templateLoadStore,immediates);

	bool store = (flags & MIPSM_STORE) != 0;
	return createMacro(parser,macroText,flags, {
			{ "%upper%",	(flags & MIPSM_UPPER) ? "1" : "0" },
			{ "%lower%",	(flags & MIPSM_LOWER) ? "1" : "0" },
			{ "%rs%",		isCop ? registers.frs.name.string() : registers.grs.name.string() },
			{ "%temp%",	isCop || store ? "r1" : registers.grs.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
			{ "%op%",		op },
	});
}